

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_init.c
# Opt level: O0

int dodiscovered(void)

{
  char let;
  boolean bVar1;
  int iVar2;
  undefined4 *puVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  nh_menuitem *_item__5;
  nh_menuitem *_item__4;
  nh_menuitem *_item__3;
  nh_menuitem *_item__2;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  char buf [256];
  menulist menu;
  char classes [18];
  char prev_class;
  char oclass;
  char *s;
  int local_10;
  int ct;
  int dis;
  int i;
  
  s._4_4_ = 0;
  init_menulist((menulist *)(buf + 0xf8));
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    buf._248_8_ = realloc((void *)buf._248_8_,(long)(int)menu.items * 0x10c);
  }
  puVar3 = (undefined4 *)(buf._248_8_ + (long)menu.items._4_4_ * 0x10c);
  *puVar3 = 0;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 0x42) = 0;
  *(undefined1 *)((long)puVar3 + 0x109) = 0;
  *(undefined1 *)((long)puVar3 + 0x10a) = 0;
  strcpy((char *)(puVar3 + 2),"Discoveries");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    buf._248_8_ = realloc((void *)buf._248_8_,(long)(int)menu.items * 0x10c);
  }
  puVar3 = (undefined4 *)(buf._248_8_ + (long)menu.items._4_4_ * 0x10c);
  *puVar3 = 0;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 0x42) = 0;
  *(undefined1 *)((long)puVar3 + 0x109) = 0;
  *(undefined1 *)((long)puVar3 + 0x10a) = 0;
  strcpy((char *)(puVar3 + 2),"");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  local_10 = 0;
  for (ct = 0; ct < 4; ct = ct + 1) {
    if ((objects[uniq_objs[ct]].field_0x10 & 1) != 0) {
      if (local_10 == 0) {
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          buf._248_8_ = realloc((void *)buf._248_8_,(long)(int)menu.items * 0x10c);
        }
        puVar3 = (undefined4 *)(buf._248_8_ + (long)menu.items._4_4_ * 0x10c);
        *puVar3 = 0;
        puVar3[1] = 2;
        *(undefined1 *)(puVar3 + 0x42) = 0;
        *(undefined1 *)((long)puVar3 + 0x109) = 0;
        *(undefined1 *)((long)puVar3 + 0x10a) = 0;
        strcpy((char *)(puVar3 + 2),"Unique Items");
        menu.items._4_4_ = menu.items._4_4_ + 1;
      }
      sprintf((char *)&_item_,"  %s",obj_descr[objects[uniq_objs[ct]].oc_name_idx].oc_name);
      if ((int)menu.items <= menu.items._4_4_) {
        menu.items._0_4_ = (int)menu.items << 1;
        buf._248_8_ = realloc((void *)buf._248_8_,(long)(int)menu.items * 0x10c);
      }
      puVar3 = (undefined4 *)(buf._248_8_ + (long)menu.items._4_4_ * 0x10c);
      *puVar3 = 0;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 0x42) = 0;
      *(undefined1 *)((long)puVar3 + 0x109) = 0;
      *(undefined1 *)((long)puVar3 + 0x10a) = 0;
      strcpy((char *)(puVar3 + 2),(char *)&_item_);
      menu.items._4_4_ = menu.items._4_4_ + 1;
      s._4_4_ = s._4_4_ + 1;
      local_10 = local_10 + 1;
    }
  }
  iVar2 = disp_artifact_discoveries((menulist *)(buf + 0xf8));
  s._4_4_ = iVar2 + s._4_4_;
  strcpy((char *)&menu.size,flags.inv_order);
  pcVar4 = strchr((char *)&menu.size,0x11);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = eos((char *)&menu.size);
    *pcVar4 = '\x11';
    pcVar4[1] = '\0';
  }
  for (unique0x00004780 = &menu.size; (char)*stack0xffffffffffffffe0 != '\0';
      register0x00000000 = (int *)((long)stack0xffffffffffffffe0 + 1)) {
    let = (char)*stack0xffffffffffffffe0;
    classes[0xe] = let + '\x01';
    ct = bases[(int)let];
    while( true ) {
      bVar6 = false;
      if (ct < 0x21a) {
        bVar6 = objects[ct].oc_class == let;
      }
      if (!bVar6) break;
      iVar2 = (int)disco[ct];
      if (iVar2 != 0) {
        bVar1 = interesting_to_discover(iVar2);
        if (bVar1 != '\0') {
          s._4_4_ = s._4_4_ + 1;
          if (let != classes[0xe]) {
            if ((int)menu.items <= menu.items._4_4_) {
              menu.items._0_4_ = (int)menu.items << 1;
              buf._248_8_ = realloc((void *)buf._248_8_,(long)(int)menu.items * 0x10c);
            }
            puVar3 = (undefined4 *)(buf._248_8_ + (long)menu.items._4_4_ * 0x10c);
            *puVar3 = 0;
            puVar3[1] = 2;
            *(undefined1 *)(puVar3 + 0x42) = 0;
            *(undefined1 *)((long)puVar3 + 0x109) = 0;
            *(undefined1 *)((long)puVar3 + 0x10a) = 0;
            pcVar4 = let_to_name(let,'\0');
            strcpy((char *)(puVar3 + 2),pcVar4);
            menu.items._4_4_ = menu.items._4_4_ + 1;
            classes[0xe] = let;
          }
          pcVar4 = " ";
          if (((byte)objects[iVar2].field_0x10 >> 3 & 1) != 0) {
            pcVar4 = "*";
          }
          pcVar5 = obj_typename(iVar2);
          sprintf((char *)&_item_,"%s %s",pcVar4,pcVar5);
          if ((int)menu.items <= menu.items._4_4_) {
            menu.items._0_4_ = (int)menu.items << 1;
            buf._248_8_ = realloc((void *)buf._248_8_,(long)(int)menu.items * 0x10c);
          }
          puVar3 = (undefined4 *)(buf._248_8_ + (long)menu.items._4_4_ * 0x10c);
          *puVar3 = 0;
          puVar3[1] = 0;
          *(undefined1 *)(puVar3 + 0x42) = 0;
          *(undefined1 *)((long)puVar3 + 0x109) = 0;
          *(undefined1 *)((long)puVar3 + 0x10a) = 0;
          strcpy((char *)(puVar3 + 2),(char *)&_item_);
          menu.items._4_4_ = menu.items._4_4_ + 1;
        }
      }
      ct = ct + 1;
    }
  }
  if (s._4_4_ == 0) {
    pline("You haven\'t discovered anything yet...");
  }
  else {
    display_menu((nh_menuitem *)buf._248_8_,menu.items._4_4_,(char *)0x0,0,(int *)0x0);
  }
  free((void *)buf._248_8_);
  return 0;
}

Assistant:

int dodiscovered(void)
{
    int i, dis;
    int	ct = 0;
    char *s, oclass, prev_class, classes[MAXOCLASSES];
    struct menulist menu;
    char buf[BUFSZ];

    init_menulist(&menu);
    add_menutext(&menu, "Discoveries");
    add_menutext(&menu, "");

    /* gather "unique objects" into a pseudo-class; note that they'll
       also be displayed individually within their regular class */
    for (i = dis = 0; i < SIZE(uniq_objs); i++)
	if (objects[uniq_objs[i]].oc_name_known) {
	    if (!dis++)
		add_menuheading(&menu, "Unique Items");
	    sprintf(buf, "  %s", OBJ_NAME(objects[uniq_objs[i]]));
	    add_menutext(&menu, buf);
	    ++ct;
	}
    /* display any known artifacts as another pseudo-class */
    ct += disp_artifact_discoveries(&menu);

    /* several classes are omitted from packorder; one is of interest here */
    strcpy(classes, flags.inv_order);
    if (!strchr(classes, VENOM_CLASS)) {
	s = eos(classes);
	*s++ = VENOM_CLASS;
	*s = '\0';
    }

    for (s = classes; *s; s++) {
	oclass = *s;
	prev_class = oclass + 1;	/* forced different from oclass */
	for (i = bases[(int)oclass];
	     i < NUM_OBJECTS && objects[i].oc_class == oclass; i++) {
	    if ((dis = disco[i]) && interesting_to_discover(dis)) {
		ct++;
		if (oclass != prev_class) {
		    add_menuheading(&menu, let_to_name(oclass, FALSE));
		    prev_class = oclass;
		}
		sprintf(buf, "%s %s",(objects[dis].oc_pre_discovered ? "*" : " "),
				obj_typename(dis));
		add_menutext(&menu, buf);
	    }
	}
    }
    if (ct == 0) {
	pline("You haven't discovered anything yet...");
    } else
	display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
    free(menu.items);

    return 0;
}